

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void Curl_detach_connection(Curl_easy *data)

{
  connectdata *conn_00;
  connectdata *conn;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  if (conn_00 != (connectdata *)0x0) {
    Curl_connect_done(data);
    Curl_llist_remove(&conn_00->easyq,&data->conn_queue,(void *)0x0);
    Curl_ssl_detach_conn(data,conn_00);
  }
  data->conn = (connectdata *)0x0;
  return;
}

Assistant:

void Curl_detach_connection(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;
  if(conn) {
    Curl_connect_done(data); /* if mid-CONNECT, shut it down */
    Curl_llist_remove(&conn->easyq, &data->conn_queue, NULL);
    Curl_ssl_detach_conn(data, conn);
  }
  data->conn = NULL;
}